

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

void __thiscall Highs::deprecationMessage(Highs *this,string *method_name,string *alt_method_name)

{
  pointer pcVar1;
  int iVar2;
  HighsLogOptions *log_options_;
  
  iVar2 = std::__cxx11::string::compare((char *)alt_method_name);
  log_options_ = &(this->options_).super_HighsOptionsStruct.log_options;
  pcVar1 = (method_name->_M_dataplus)._M_p;
  if (iVar2 != 0) {
    highsLogUser(log_options_,kWarning,"Method %s is deprecated: alternative method is %s\n",pcVar1,
                 (alt_method_name->_M_dataplus)._M_p);
    return;
  }
  highsLogUser(log_options_,kWarning,"Method %s is deprecated: no alternative method\n",pcVar1);
  return;
}

Assistant:

void Highs::deprecationMessage(const std::string& method_name,
                               const std::string& alt_method_name) const {
  if (alt_method_name.compare("None") == 0) {
    highsLogUser(options_.log_options, HighsLogType::kWarning,
                 "Method %s is deprecated: no alternative method\n",
                 method_name.c_str());
  } else {
    highsLogUser(options_.log_options, HighsLogType::kWarning,
                 "Method %s is deprecated: alternative method is %s\n",
                 method_name.c_str(), alt_method_name.c_str());
  }
}